

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

QAbstractItemViewPrivate * __thiscall
QAbstractItemViewPrivate::renderToPixmap
          (QAbstractItemViewPrivate *this,QModelIndexList *indexes,QRect *r)

{
  undefined1 *puVar1;
  QModelIndex *pQVar2;
  undefined1 auVar3 [16];
  undefined4 uVar4;
  uint uVar5;
  QWindow *pQVar6;
  long *plVar7;
  int iVar8;
  undefined8 *in_RCX;
  ulong uVar9;
  ulong uVar10;
  undefined1 *puVar11;
  ulong uVar12;
  long lVar13;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  double dVar14;
  double dVar15;
  double dVar16;
  QPainter painter;
  undefined1 *local_130;
  QArrayData *local_128;
  undefined1 *puStack_120;
  undefined1 *local_118;
  QStyleOptionViewItem local_108;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (indexes->d).ptr;
  local_118 = &DAT_aaaaaaaaaaaaaaaa;
  local_128 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_120 = &DAT_aaaaaaaaaaaaaaaa;
  (*(code *)(indexes->d).d[0x12].super_QArrayData.alloc)(&local_128);
  if (local_118 == (undefined1 *)0x0) {
    QPixmap::QPixmap((QPixmap *)this);
  }
  else {
    pQVar6 = QWidgetPrivate::windowHandle((QWidgetPrivate *)indexes,Closest);
    if (pQVar6 == (QWindow *)0x0) {
      dVar14 = 1.0;
      uVar4 = 0;
    }
    else {
      uVar4 = QWindow::devicePixelRatio();
      dVar14 = extraout_XMM0_Qa;
    }
    *(undefined1 **)
     &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.field_0x10 =
         &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)
     &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate =
         &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)
     &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.field_0x8 =
         &DAT_aaaaaaaaaaaaaaaa;
    dVar15 = dVar14 * (double)(((int)in_RCX[1] - (int)*in_RCX) + 1);
    dVar16 = dVar14 * (double)(((int)((ulong)in_RCX[1] >> 0x20) - (int)((ulong)*in_RCX >> 0x20)) + 1
                              );
    dVar15 = (double)((ulong)dVar15 & 0x8000000000000000 | 0x3fe0000000000000) + dVar15;
    dVar16 = (double)((ulong)dVar16 & 0x8000000000000000 | 0x3fe0000000000000) + dVar16;
    auVar3._4_4_ = -(uint)(-2147483648.0 < dVar15);
    auVar3._0_4_ = -(uint)(-2147483648.0 < dVar16);
    auVar3._8_4_ = -(uint)(2147483647.0 < dVar16);
    auVar3._12_4_ = -(uint)(2147483647.0 < dVar15);
    uVar5 = movmskps(uVar4,auVar3);
    uVar10 = 0x80000000;
    if ((uVar5 & 2) != 0) {
      uVar10 = (ulong)(uint)(int)dVar15;
    }
    uVar12 = 0x8000000000000000;
    if ((uVar5 & 1) != 0) {
      uVar12 = (ulong)(uint)(int)dVar16 << 0x20;
    }
    uVar9 = 0x7fffffff00000000;
    if ((uVar5 & 4) == 0) {
      uVar9 = uVar12;
    }
    local_108.super_QStyleOption._0_8_ = 0x7fffffff;
    if ((uVar5 & 8) == 0) {
      local_108.super_QStyleOption._0_8_ = uVar10;
    }
    local_108.super_QStyleOption._0_8_ = local_108.super_QStyleOption._0_8_ | uVar9;
    QPixmap::QPixmap((QPixmap *)this,(QSize *)&local_108);
    QPixmap::setDevicePixelRatio(dVar14);
    QColor::QColor((QColor *)&local_108,transparent);
    QPixmap::fill((QColor *)this);
    local_130 = &DAT_aaaaaaaaaaaaaaaa;
    QPainter::QPainter((QPainter *)&local_130,(QPaintDevice *)this);
    memset(&local_108,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem(&local_108);
    (**(code **)(*(long *)pQVar2 + 0x2f8))(pQVar2,&local_108);
    local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i._1_1_ =
         local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
         super_QFlagsStorage<QStyle::StateFlag>.i._1_1_ | 0x80;
    if (local_118 != (undefined1 *)0x0) {
      lVar13 = 0x10;
      puVar11 = (undefined1 *)0x0;
      do {
        puVar1 = puStack_120 + lVar13;
        iVar8 = (int)*in_RCX;
        local_108.super_QStyleOption.rect.x1.m_i = *(int *)(puStack_120 + lVar13 + -0x10) - iVar8;
        local_108.super_QStyleOption.rect.x2.m_i = *(int *)(puStack_120 + lVar13 + -8) - iVar8;
        iVar8 = (int)((ulong)*in_RCX >> 0x20);
        local_108.super_QStyleOption.rect.y1.m_i = *(int *)(puStack_120 + lVar13 + -0xc) - iVar8;
        local_108.super_QStyleOption.rect.y2.m_i = *(int *)(puStack_120 + lVar13 + -4) - iVar8;
        (**(code **)&(indexes->d).d[0x13].super_QArrayData)(indexes,&local_108,puVar1);
        plVar7 = (long *)(**(code **)(*(long *)pQVar2 + 0x208))(pQVar2,puVar1);
        (**(code **)(*plVar7 + 0x60))(plVar7,&local_130,&local_108,puVar1);
        puVar11 = puVar11 + 1;
        lVar13 = lVar13 + 0x28;
      } while (puVar11 < local_118);
    }
    QBrush::~QBrush(&local_108.backgroundBrush);
    if (&(local_108.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_108.text.d.d)->super_QArrayData,2,0x10);
      }
    }
    QIcon::~QIcon(&local_108.icon);
    QLocale::~QLocale(&local_108.locale);
    QFont::~QFont(&local_108.font);
    QStyleOption::~QStyleOption(&local_108.super_QStyleOption);
    QPainter::~QPainter((QPainter *)&local_130);
  }
  if (local_128 != (QArrayData *)0x0) {
    LOCK();
    (local_128->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_128->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_128->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_128,0x28,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QPixmap QAbstractItemViewPrivate::renderToPixmap(const QModelIndexList &indexes, QRect *r) const
{
    Q_Q(const QAbstractItemView);
    Q_ASSERT(r);
    QItemViewPaintPairs paintPairs = draggablePaintPairs(indexes, r);
    if (paintPairs.isEmpty())
        return QPixmap();

    QWindow *window = windowHandle(WindowHandleMode::Closest);
    const qreal scale = window ? window->devicePixelRatio() : qreal(1);

    QPixmap pixmap(r->size() * scale);
    pixmap.setDevicePixelRatio(scale);

    pixmap.fill(Qt::transparent);
    QPainter painter(&pixmap);
    QStyleOptionViewItem option;
    q->initViewItemOption(&option);
    option.state |= QStyle::State_Selected;
    for (int j = 0; j < paintPairs.size(); ++j) {
        option.rect = paintPairs.at(j).rect.translated(-r->topLeft());
        const QModelIndex &current = paintPairs.at(j).index;
        adjustViewOptionsForIndex(&option, current);
        q->itemDelegateForIndex(current)->paint(&painter, option, current);
    }
    return pixmap;
}